

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O2

void Image_Function::Median
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,uint32_t kernelSize)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  imageException *this;
  Image *pIVar5;
  Image *pIVar6;
  uchar *__nth;
  uint32_t height_00;
  uint32_t startXIn_00;
  undefined4 in_register_00000034;
  ulong uVar7;
  uchar *puVar8;
  undefined4 in_register_00000084;
  uint32_t startXOut_00;
  uint height_01;
  uint32_t startYOut_00;
  allocator_type local_b1;
  uchar *local_b0;
  Image *local_a8;
  ulong local_a0;
  Image *local_98;
  ulong local_90;
  uchar *local_88;
  ulong local_80;
  uchar *local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  ImageTemplate<unsigned_char> local_58;
  
  local_a0 = CONCAT44(in_register_00000084,startXOut);
  local_b0 = (uchar *)CONCAT44(in_register_00000034,startXIn);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  local_98 = out;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  if ((((kernelSize < height) && (kernelSize < width)) && (2 < kernelSize)) &&
     ((kernelSize & 1) != 0)) {
    height_01 = kernelSize >> 1;
    startXOut_00 = (uint32_t)local_a0;
    local_a8 = in;
    Copy(in,(uint32_t)local_b0,startYIn,local_98,startXOut_00,startYOut,width,height_01);
    pIVar6 = local_98;
    Copy(in,(uint32_t)local_b0,(height + startYIn) - height_01,local_98,startXOut_00,
         (height + startYOut) - height_01,width,height_01);
    startYOut_00 = startYOut + height_01;
    local_78 = (uchar *)CONCAT44(local_78._4_4_,height_01 + startYIn);
    height_00 = height - (kernelSize - 1);
    local_88 = (uchar *)CONCAT44(local_88._4_4_,kernelSize - 1);
    startXIn_00 = (uint32_t)local_b0;
    local_90 = (ulong)startYIn;
    Copy(local_a8,startXIn_00,height_01 + startYIn,pIVar6,startXOut_00,startYOut_00,height_01,
         height_00);
    pIVar5 = local_a8;
    local_80 = (ulong)width;
    Copy(local_a8,(width + startXIn_00) - height_01,(uint32_t)local_78,pIVar6,
         (width + startXOut_00) - height_01,startYOut_00,height_01,height_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&data,(ulong)(kernelSize * kernelSize),&local_b1);
    uVar2 = pIVar5->_rowSize;
    uVar7 = (ulong)local_b0 & 0xffffffff;
    local_b0 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    pIVar5 = (Image *)(pIVar5->_data + uVar7 + (int)local_90 * uVar2);
    uVar3 = pIVar6->_rowSize;
    local_90 = (ulong)uVar3;
    local_80 = (ulong)(uint)((int)local_80 - (int)local_88);
    local_98 = (Image *)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
    puVar8 = pIVar6->_data +
             (ulong)height_01 + (local_a0 & 0xffffffff) + (ulong)(startYOut_00 * uVar3);
    local_a0 = (ulong)(uVar2 * kernelSize);
    local_88 = puVar8 + height_00 * uVar3;
    __nth = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start +
            ((ulong)((long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 1);
    while (puVar8 != local_88) {
      puVar1 = puVar8 + local_80;
      local_a8 = pIVar5;
      local_78 = puVar8;
      for (; puVar8 != puVar1; puVar8 = puVar8 + 1) {
        puVar4 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (pIVar6 = pIVar5; pIVar6 != (Image *)((long)&pIVar5->_vptr_ImageTemplate + local_a0);
            pIVar6 = (Image *)((long)&pIVar6->_vptr_ImageTemplate + (ulong)uVar2)) {
          for (uVar7 = 0; kernelSize != uVar7; uVar7 = uVar7 + 1) {
            puVar4[uVar7] = *(uchar *)((long)&pIVar6->_vptr_ImageTemplate + uVar7);
          }
          puVar4 = puVar4 + uVar7;
        }
        std::nth_element<unsigned_char*>(local_b0,__nth,(uchar *)local_98);
        pIVar5 = (Image *)((long)&pIVar5->_vptr_ImageTemplate + 1);
        *puVar8 = *__nth;
      }
      pIVar5 = (Image *)((long)&local_a8->_vptr_ImageTemplate + (ulong)uVar2);
      puVar8 = local_78 + local_90;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Kernel size for filter is not correct");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Median( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                 uint32_t width, uint32_t height, uint32_t kernelSize )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if( kernelSize < 3 || kernelSize % 2 == 0 || kernelSize >= width || kernelSize >= height )
            throw imageException( "Kernel size for filter is not correct" );

        // Border's problem is well-known problem which can be solved in different ways
        // We just copy parts of original image without applying filtering
        Copy( in, startXIn, startYIn, out, startXOut,
              startYOut, width, kernelSize / 2 );
        Copy( in, startXIn, startYIn + height - kernelSize / 2, out, startXOut,
              startYOut + height - kernelSize / 2, width, kernelSize / 2 );
        Copy( in, startXIn, startYIn + kernelSize / 2, out, startXOut,
              startYOut + kernelSize / 2, kernelSize / 2, height - (kernelSize - 1) );
        Copy( in, startXIn + width - kernelSize / 2, startYIn + kernelSize / 2, out, startXOut + width - kernelSize / 2,
              startYOut + kernelSize / 2, kernelSize / 2, height - (kernelSize - 1) );

        std::vector < uint8_t > data( kernelSize * kernelSize );
        uint8_t * dataFirstValue = data.data();
        uint8_t * medianValue    = dataFirstValue + data.size() / 2;
        uint8_t * dataLastValue  = dataFirstValue + data.size();
        
        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn                     * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + (startYOut + kernelSize / 2) * rowSizeOut + startXOut + kernelSize / 2;

        width  = width  - (kernelSize - 1);
        height = height - (kernelSize - 1);

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++inX ) {
                uint8_t * value = data.data();

                const uint8_t * inYRead    = inX;
                const uint8_t * inYReadEnd = inYRead + kernelSize * rowSizeIn;

                for( ; inYRead != inYReadEnd; inYRead += rowSizeIn ) {
                    const uint8_t * inXRead    = inYRead;
                    const uint8_t * inXReadEnd = inXRead + kernelSize;

                    for( ; inXRead != inXReadEnd; ++inXRead, ++value )
                        *value = *inXRead;
                }

                std::nth_element( dataFirstValue, medianValue, dataLastValue );
                (*outX) = *medianValue;
            }
        }
    }